

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase * AnalyzeNew(ExpressionContext *ctx,SynNew *syntax)

{
  Allocator *pAVar1;
  FunctionData *pFVar2;
  ArrayView<ArgumentData> arguments_00;
  bool bVar3;
  int iVar4;
  TypeBase *pTVar5;
  TypeBase *pTVar6;
  SynBase *pSVar7;
  ExprBase *pEVar8;
  VariableData *pVVar9;
  ExprBase *pEVar10;
  undefined4 extraout_var;
  _func_int **pp_Var11;
  ExprSequence *this;
  undefined4 extraout_var_01;
  SynBase *pSVar12;
  SynBase *pSVar13;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  ExprBase **ppEVar14;
  SynIdentifier *name;
  undefined4 extraout_var_07;
  SynCallArgument *pSVar15;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  uint uVar16;
  long lVar17;
  char *pcVar18;
  ulong uVar19;
  uint count;
  SynCallArgument *pSVar20;
  long lVar21;
  SynTypeFunction *functionType;
  InplaceStr IVar22;
  ArrayView<FunctionData_*> functions_00;
  ArrayView<FunctionValue> functions_01;
  ArrayView<ExprBase_*> arr;
  ArrayView<ExprBase_*> arr_00;
  ArrayView<ExprBase_*> arr_01;
  ExprBase *function;
  TypedFunctionInstanceRequest request;
  SmallArray<FunctionData_*,_32U> functions;
  SmallArray<ArgumentData,_32U> arguments;
  SmallArray<FunctionValue,_32U> functions_1;
  ExprBase *local_b28;
  TypeBase *local_b20;
  VariableData *local_b18;
  SmallArray<ExprBase_*,_3U> local_b10;
  ArgumentData *local_ae0;
  undefined4 uStack_ad8;
  uint uStack_ad4;
  TypedFunctionInstanceRequest local_ad0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  SmallArray<FunctionData_*,_32U> local_a78;
  undefined1 local_960 [24];
  ExprBase *local_948 [2];
  TypeBase *local_938;
  Allocator *local_350;
  SmallArray<FunctionValue,_32U> local_348;
  ExprBase *first;
  undefined4 extraout_var_00;
  undefined4 extraout_var_02;
  undefined4 extraout_var_06;
  undefined4 extraout_var_08;
  
  pTVar5 = AnalyzeType(ctx,syntax->type,false,(bool *)0x0);
  if (pTVar5 == (TypeBase *)0x0) {
    if ((((syntax->count == (SynBase *)0x0) && (pSVar7 = syntax->type, pSVar7 != (SynBase *)0x0)) &&
        (pSVar7->typeID == 0x19)) && (lVar17 = *(long *)&pSVar7[1].typeID, lVar17 != 0)) {
      iVar4 = 1;
      lVar21 = lVar17;
      do {
        lVar21 = *(long *)(lVar21 + 0x30);
        iVar4 = iVar4 + -1;
      } while (lVar21 != 0);
      if ((iVar4 == 0) && (*(long *)(lVar17 + 0x40) == 0)) {
        syntax->count = *(SynBase **)(lVar17 + 0x48);
        pSVar7 = (SynBase *)pSVar7[1]._vptr_SynBase;
        syntax->type = pSVar7;
        pTVar5 = AnalyzeType(ctx,pSVar7,false,(bool *)0x0);
        goto LAB_00179c4c;
      }
    }
    pTVar5 = (TypeBase *)0x0;
  }
LAB_00179c4c:
  if (pTVar5 == (TypeBase *)0x0) {
    if ((((syntax->arguments).head == (SynCallArgument *)0x0) &&
        (pSVar7 = syntax->type, pSVar7 != (SynBase *)0x0)) && (pSVar7->typeID == 0xb)) {
      pSVar13 = *(SynBase **)&pSVar7[1].typeID;
      if (pSVar13 != (SynBase *)0x0) {
        do {
          iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
          pSVar15 = (SynCallArgument *)CONCAT44(extraout_var_08,iVar4);
          SynBase::SynBase((SynBase *)pSVar15,0x18,pSVar13->begin,pSVar13->end);
          (pSVar15->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002474f8;
          pSVar15->name = (SynIdentifier *)0x0;
          pSVar15->value = pSVar13;
          IntrusiveList<SynCallArgument>::push_back(&syntax->arguments,pSVar15);
          pSVar13 = pSVar13->next;
        } while (pSVar13 != (SynBase *)0x0);
      }
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
      pSVar13 = (SynBase *)CONCAT44(extraout_var_09,iVar4);
      pp_Var11 = pSVar7[1]._vptr_SynBase;
      SynBase::SynBase(pSVar13,10,pSVar7->begin,pSVar7->end);
      pSVar13->_vptr_SynBase = (_func_int **)&PTR__SynBase_00247300;
      pSVar13[1]._vptr_SynBase = pp_Var11;
      syntax->type = pSVar13;
      pTVar5 = AnalyzeType(ctx,pSVar13,false,(bool *)0x0);
    }
    else {
      pTVar5 = (TypeBase *)0x0;
    }
  }
  if (pTVar5 == (TypeBase *)0x0) {
    AnalyzeType(ctx,syntax->type,true,(bool *)0x0);
    pTVar5 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
  }
  if (pTVar5->isGeneric == true) {
    anon_unknown.dwarf_c6b42::Stop(ctx,syntax->type,"ERROR: generic type is not allowed");
  }
  if ((pTVar5 == ctx->typeVoid) || (pTVar5 == ctx->typeAuto)) {
    pSVar7 = syntax->type;
    uVar16 = *(int *)&(pTVar5->name).end - (int)(pTVar5->name).begin;
    pcVar18 = "ERROR: can\'t allocate objects of type \'%.*s\'";
LAB_0017a93a:
    anon_unknown.dwarf_c6b42::Stop(ctx,pSVar7,pcVar18,(ulong)uVar16);
  }
  if ((pTVar5 == (TypeBase *)0x0) || (pTVar6 = pTVar5, pTVar5->typeID != 0x18)) {
    pTVar6 = (TypeBase *)0x0;
  }
  if ((pTVar6 != (TypeBase *)0x0) && (*(char *)&pTVar6[3]._vptr_TypeBase == '\0')) {
    pSVar7 = syntax->type;
    uVar16 = *(int *)&(pTVar5->name).end - (int)(pTVar5->name).begin;
    pcVar18 = "ERROR: type \'%.*s\' is not fully defined";
    goto LAB_0017a93a;
  }
  pSVar7 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
  if (syntax->count != (SynBase *)0x0) {
    pSVar15 = (syntax->arguments).head;
    if (pSVar15 != (SynCallArgument *)0x0) {
      anon_unknown.dwarf_c6b42::Report
                (ctx,&pSVar15->super_SynBase,
                 "ERROR: can\'t provide constructor arguments to array allocation");
    }
    pSVar13 = (syntax->constructor).head;
    if (pSVar13 != (SynBase *)0x0) {
      anon_unknown.dwarf_c6b42::Report
                (ctx,pSVar13,"ERROR: can\'t provide custom construction code for array allocation");
    }
    pEVar8 = AnalyzeExpression(ctx,syntax->count);
    pEVar8 = CreateArrayAllocation(ctx,&syntax->super_SynBase,pTVar5,pEVar8);
    bVar3 = HasDefaultConstructor(ctx,&syntax->super_SynBase,pTVar5);
    if (!bVar3) {
      return pEVar8;
    }
    pVVar9 = anon_unknown.dwarf_c6b42::AllocateTemporary(ctx,&syntax->super_SynBase,pEVar8->type);
    pEVar10 = CreateVariableAccess(ctx,pSVar7,pVVar9,false);
    pEVar10 = CreateAssignment(ctx,&syntax->super_SynBase,pEVar10,pEVar8);
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    first = (ExprBase *)CONCAT44(extraout_var,iVar4);
    pTVar5 = ctx->typeVoid;
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
    pp_Var11 = (_func_int **)CONCAT44(extraout_var_00,iVar4);
    *pp_Var11 = (_func_int *)0x0;
    pp_Var11[1] = (_func_int *)pVVar9;
    pp_Var11[2] = (_func_int *)0x0;
    *(undefined1 *)(pp_Var11 + 3) = 0;
    first->typeID = 0x1e;
    first->source = pSVar7;
    first->type = pTVar5;
    first->next = (ExprBase *)0x0;
    first->listed = false;
    first->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248a48;
    first[1]._vptr_ExprBase = pp_Var11;
    *(ExprBase **)&first[1].typeID = pEVar10;
    pTVar5 = pVVar9->type;
    pEVar10 = CreateVariableAccess(ctx,pSVar7,pVVar9,true);
    pEVar10 = CreateDefaultConstructorCall(ctx,&syntax->super_SynBase,pTVar5,pEVar10);
    if (pEVar10 == (ExprBase *)0x0) {
      return pEVar8;
    }
    pEVar8 = CreateVariableAccess(ctx,pSVar7,pVVar9,true);
    pEVar8 = CreateSequence(ctx,&syntax->super_SynBase,first,pEVar10,pEVar8);
    return pEVar8;
  }
  this = (ExprSequence *)CreateObjectAllocation(ctx,&syntax->super_SynBase,pTVar5);
  pTVar5 = (this->super_ExprBase).type;
  if ((pTVar5 == (TypeBase *)0x0) || (pTVar5->typeID != 0x12)) {
    pTVar5 = (TypeBase *)0x0;
  }
  local_b20 = (TypeBase *)pTVar5[1]._vptr_TypeBase;
  local_a78.allocator = ctx->allocator;
  local_a78.data = local_a78.little;
  local_a78.count = 0;
  local_a78.max = 0x20;
  bVar3 = GetTypeConstructorFunctions
                    (ctx,local_b20,(syntax->arguments).head == (SynCallArgument *)0x0,&local_a78);
  if (bVar3) {
    pVVar9 = anon_unknown.dwarf_c6b42::AllocateTemporary
                       (ctx,&syntax->super_SynBase,(this->super_ExprBase).type);
    pEVar8 = CreateVariableAccess(ctx,pSVar7,pVVar9,false);
    pEVar8 = CreateAssignment(ctx,pSVar7,pEVar8,(ExprBase *)this);
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pSVar13 = (SynBase *)CONCAT44(extraout_var_01,iVar4);
    pTVar6 = ctx->typeVoid;
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
    pSVar12 = (SynBase *)CONCAT44(extraout_var_02,iVar4);
    pSVar12->_vptr_SynBase = (_func_int **)0x0;
    *(VariableData **)&pSVar12->typeID = pVVar9;
    pSVar12->begin = (Lexeme *)0x0;
    *(undefined1 *)&pSVar12->end = 0;
    pSVar13->typeID = 0x1e;
    pSVar13->begin = (Lexeme *)pSVar7;
    pSVar13->end = (Lexeme *)pTVar6;
    (pSVar13->pos).begin = (char *)0x0;
    *(bool *)&(pSVar13->pos).end = false;
    pSVar13->_vptr_SynBase = (_func_int **)&PTR__ExprBase_00248a48;
    pSVar13->next = pSVar12;
    *(ExprBase **)&pSVar13->listed = pEVar8;
    functions_00.count = local_a78.count;
    functions_00.data = local_a78.data;
    local_b18 = pVVar9;
    pEVar8 = CreateVariableAccess(ctx,pSVar7,pVVar9,false);
    functions_00._12_4_ = 0;
    pEVar8 = CreateConstructorAccess(ctx,&syntax->super_SynBase,functions_00,pEVar8);
    pSVar15 = (syntax->arguments).head;
    pEVar8 = CreateFunctionCall(ctx,&syntax->super_SynBase,pEVar8,
                                (IntrusiveList<TypeHandle>)ZEXT816(0),pSVar15,
                                pSVar15 == (SynCallArgument *)0x0);
    if (pEVar8 != (ExprBase *)0x0) {
      local_938 = (TypeBase *)ctx->allocator;
      local_960._0_8_ = local_960 + 0x10;
      local_960._8_4_ = 2;
      local_960._12_4_ = 3;
      local_960._16_8_ = pSVar13;
      local_948[0] = pEVar8;
      pSVar13 = (SynBase *)CreateVariableAccess(ctx,pSVar7,local_b18,false);
      if (local_960._8_4_ == local_960._12_4_) {
        SmallArray<ExprBase_*,_3U>::grow((SmallArray<ExprBase_*,_3U> *)local_960,local_960._8_4_);
      }
      if ((ArgumentData *)local_960._0_8_ == (ArgumentData *)0x0) goto LAB_0017a944;
      uVar19 = (ulong)(uint)local_960._8_4_;
      local_960._8_4_ = local_960._8_4_ + 1;
      ((SynBase **)local_960._0_8_)[uVar19] = pSVar13;
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
      this = (ExprSequence *)CONCAT44(extraout_var_03,iVar4);
      arr.count = local_960._8_4_;
      arr.data = (ExprBase **)local_960._0_8_;
      arr._12_4_ = 0;
      ExprSequence::ExprSequence(this,ctx->allocator,&syntax->super_SynBase,pTVar5,arr);
LAB_0017a0d1:
      SmallArray<ExprBase_*,_3U>::~SmallArray((SmallArray<ExprBase_*,_3U> *)local_960);
    }
LAB_0017a119:
    if ((syntax->constructor).head == (SynBase *)0x0) {
LAB_0017a58a:
      SmallArray<FunctionData_*,_32U>::~SmallArray(&local_a78);
      return &this->super_ExprBase;
    }
    pVVar9 = anon_unknown.dwarf_c6b42::AllocateTemporary
                       (ctx,&syntax->super_SynBase,(this->super_ExprBase).type);
    pEVar8 = CreateVariableAccess(ctx,pSVar7,pVVar9,false);
    pEVar8 = CreateAssignment(ctx,pSVar7,pEVar8,&this->super_ExprBase);
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pEVar10 = (ExprBase *)CONCAT44(extraout_var_04,iVar4);
    pTVar6 = ctx->typeVoid;
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
    pp_Var11 = (_func_int **)CONCAT44(extraout_var_05,iVar4);
    iVar4 = 0;
    *pp_Var11 = (_func_int *)0x0;
    pp_Var11[1] = (_func_int *)pVVar9;
    pp_Var11[2] = (_func_int *)0x0;
    *(undefined1 *)(pp_Var11 + 3) = 0;
    pEVar10->typeID = 0x1e;
    pEVar10->source = pSVar7;
    pEVar10->type = pTVar6;
    pEVar10->next = (ExprBase *)0x0;
    pEVar10->listed = false;
    pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248a48;
    pEVar10[1]._vptr_ExprBase = pp_Var11;
    *(ExprBase **)&pEVar10[1].typeID = pEVar8;
    local_ad0.instanceType = local_b20;
    if (local_b20 != (TypeBase *)0x0) {
      iVar4 = local_b20->nameHash * 0x21;
    }
    local_ad0.hash = (int)((ulong)syntax >> 0x10) + (int)syntax + iVar4;
    local_b28 = (ExprBase *)0x0;
    local_ad0.syntax = &syntax->super_SynBase;
    ppEVar14 = SmallDenseMap<TypedFunctionInstanceRequest,_ExprBase_*,_TypedFunctionInstanceRequestHasher,_32U>
               ::find(&ctx->newConstructorFunctions,&local_ad0);
    if (ppEVar14 != (ExprBase **)0x0) {
      local_b28 = *ppEVar14;
    }
    if (local_b28 == (ExprBase *)0x0) {
      IVar22 = GetTemporaryFunctionName(ctx);
      local_b18 = (VariableData *)IVar22.end;
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      name = (SynIdentifier *)CONCAT44(extraout_var_06,iVar4);
      (name->super_SynBase).typeID = 4;
      (name->super_SynBase).begin = (Lexeme *)0x0;
      (name->super_SynBase).end = (Lexeme *)0x0;
      (name->super_SynBase).pos.begin = (char *)0x0;
      (name->super_SynBase).pos.end = (char *)0x0;
      *(undefined8 *)((long)&(name->super_SynBase).pos.end + 2) = 0;
      *(undefined8 *)((long)&(name->super_SynBase).next + 2) = 0;
      (name->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002470a0;
      (name->name).begin = IVar22.begin;
      (name->name).end = (char *)local_b18;
      local_a88 = 0;
      uStack_a80 = 0;
      local_a98 = 0;
      uStack_a90 = 0;
      local_aa8 = 0;
      uStack_aa0 = 0;
      local_b28 = CreateFunctionDefinition
                            (ctx,&syntax->super_SynBase,false,false,local_b20,false,ctx->typeVoid,
                             false,name,(IntrusiveList<SynIdentifier>)ZEXT816(0),
                             (IntrusiveList<SynFunctionArgument>)ZEXT816(0),syntax->constructor,
                             (FunctionData *)0x0,(TypeFunction *)0x0,
                             (IntrusiveList<MatchData>)ZEXT816(0));
      SmallDenseMap<TypedFunctionInstanceRequest,_ExprBase_*,_TypedFunctionInstanceRequestHasher,_32U>
      ::insert(&ctx->newConstructorFunctions,&local_ad0,&local_b28);
    }
    pEVar8 = local_b28;
    pAVar1 = ctx->allocator;
    memset(local_348.little,0,0x300);
    local_348.count = 0;
    local_348.max = 0x20;
    pFVar2 = (FunctionData *)pEVar8[1]._vptr_ExprBase;
    local_348.data = local_348.little;
    local_348.allocator = pAVar1;
    pEVar8 = CreateVariableAccess(ctx,pSVar7,pVVar9,false);
    if (pEVar8 == (ExprBase *)0x0) {
      __assert_fail("context",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.h"
                    ,0x289,"FunctionValue::FunctionValue(SynBase *, FunctionData *, ExprBase *)");
    }
    if (local_348.count == local_348.max) {
      SmallArray<FunctionValue,_32U>::grow(&local_348,local_348.count);
    }
    if (local_348.data == (FunctionValue *)0x0) {
      pcVar18 = 
      "void SmallArray<FunctionValue, 32>::push_back(const T &) [T = FunctionValue, N = 32]";
      goto LAB_0017a98f;
    }
    uVar19 = local_348._8_8_ & 0xffffffff;
    functions_01.count = local_348.count + 1;
    local_348.count = functions_01.count;
    local_348.data[uVar19].source = &syntax->super_SynBase;
    local_348.data[uVar19].function = pFVar2;
    local_348.data[uVar19].context = pEVar8;
    local_350 = ctx->allocator;
    lVar17 = 0x20;
    do {
      *(undefined8 *)(local_960 + lVar17 + -0x10) = 0;
      local_960[lVar17 + -8] = 0;
      *(undefined8 *)(local_960 + lVar17) = 0;
      *(undefined8 *)(local_960 + lVar17 + 8) = 0;
      *(undefined8 *)((long)local_948 + lVar17 + -8) = 0;
      *(undefined8 *)((long)local_948 + lVar17) = 0;
      lVar17 = lVar17 + 0x30;
    } while (lVar17 != 0x620);
    local_ae0 = (ArgumentData *)(local_960 + 0x10);
    local_960._8_4_ = 0;
    local_960._12_4_ = 0x20;
    local_ab8 = 0;
    uStack_ab0 = 0;
    uStack_ad8 = 0;
    arguments_00._8_8_ = (ulong)uStack_ad4 << 0x20;
    arguments_00.data = local_ae0;
    functions_01.data = local_348.data;
    functions_01._12_4_ = 0;
    local_960._0_8_ = local_ae0;
    local_b10.little[1] =
         CreateFunctionCallFinal
                   (ctx,&syntax->super_SynBase,local_b28,functions_01,
                    (IntrusiveList<TypeHandle>)ZEXT816(0),arguments_00,false);
    local_b10.allocator = ctx->allocator;
    local_b10.data = local_b10.little;
    local_b10.count = 2;
    local_b10.max = 3;
    local_b10.little[0] = pEVar10;
    pEVar8 = CreateVariableAccess(ctx,pSVar7,pVVar9,false);
    if (local_b10.count == local_b10.max) {
      SmallArray<ExprBase_*,_3U>::grow(&local_b10,local_b10.count);
    }
    if (local_b10.data != (ExprBase **)0x0) {
      uVar19 = (ulong)local_b10.count;
      local_b10.count = local_b10.count + 1;
      local_b10.data[uVar19] = pEVar8;
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
      this = (ExprSequence *)CONCAT44(extraout_var_07,iVar4);
      arr_00.count = local_b10.count;
      arr_00.data = local_b10.data;
      arr_00._12_4_ = 0;
      ExprSequence::ExprSequence(this,ctx->allocator,&syntax->super_SynBase,pTVar5,arr_00);
      SmallArray<ExprBase_*,_3U>::~SmallArray(&local_b10);
      SmallArray<ArgumentData,_32U>::~SmallArray((SmallArray<ArgumentData,_32U> *)local_960);
      SmallArray<FunctionValue,_32U>::~SmallArray(&local_348);
      goto LAB_0017a58a;
    }
  }
  else {
    pSVar15 = (syntax->arguments).head;
    if (pSVar15 == (SynCallArgument *)0x0) goto LAB_0017a119;
    iVar4 = 1;
    pSVar20 = pSVar15;
    do {
      pSVar20 = (SynCallArgument *)(pSVar20->super_SynBase).next;
      iVar4 = iVar4 + -1;
    } while (pSVar20 != (SynCallArgument *)0x0);
    if ((iVar4 != 0) || (pSVar15->name != (SynIdentifier *)0x0)) {
      if (pSVar15 != (SynCallArgument *)0x0) {
        pcVar18 = (local_b20->name).begin;
        uVar19 = (long)(local_b20->name).end - (long)pcVar18;
        iVar4 = 0;
        do {
          iVar4 = iVar4 + 1;
          pSVar15 = (SynCallArgument *)(pSVar15->super_SynBase).next;
        } while (pSVar15 != (SynCallArgument *)0x0);
        anon_unknown.dwarf_c6b42::Stop
                  (ctx,&syntax->super_SynBase,
                   "ERROR: function \'%.*s::%.*s\' that accepts %d arguments is undefined",uVar19,
                   pcVar18,uVar19 & 0xffffffff,(int)pcVar18,iVar4);
      }
      goto LAB_0017a119;
    }
    pVVar9 = anon_unknown.dwarf_c6b42::AllocateTemporary
                       (ctx,&syntax->super_SynBase,(this->super_ExprBase).type);
    pEVar8 = CreateVariableAccess(ctx,pSVar7,pVVar9,false);
    pEVar8 = CreateAssignment(ctx,pSVar7,pEVar8,(ExprBase *)this);
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pSVar13 = (SynBase *)CONCAT44(extraout_var_10,iVar4);
    pTVar6 = ctx->typeVoid;
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
    pSVar12 = (SynBase *)CONCAT44(extraout_var_11,iVar4);
    pSVar12->_vptr_SynBase = (_func_int **)0x0;
    *(VariableData **)&pSVar12->typeID = pVVar9;
    pSVar12->begin = (Lexeme *)0x0;
    *(undefined1 *)&pSVar12->end = 0;
    pSVar13->typeID = 0x1e;
    pSVar13->begin = (Lexeme *)pSVar7;
    pSVar13->end = (Lexeme *)pTVar6;
    (pSVar13->pos).begin = (char *)0x0;
    *(bool *)&(pSVar13->pos).end = false;
    pSVar13->_vptr_SynBase = (_func_int **)&PTR__ExprBase_00248a48;
    pSVar13->next = pSVar12;
    *(ExprBase **)&pSVar13->listed = pEVar8;
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pEVar8 = (ExprBase *)CONCAT44(extraout_var_12,iVar4);
    pEVar10 = CreateVariableAccess(ctx,pSVar7,pVVar9,false);
    pEVar8->typeID = 0x16;
    pEVar8->source = &syntax->super_SynBase;
    pEVar8->type = local_b20;
    pEVar8->next = (ExprBase *)0x0;
    pEVar8->listed = false;
    pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248a80;
    pEVar8[1]._vptr_ExprBase = (_func_int **)pEVar10;
    pEVar10 = AnalyzeExpression(ctx,((syntax->arguments).head)->value);
    local_948[0] = CreateAssignment(ctx,&syntax->super_SynBase,pEVar8,pEVar10);
    local_938 = (TypeBase *)ctx->allocator;
    local_960._0_8_ = local_960 + 0x10;
    local_960._8_4_ = 2;
    local_960._12_4_ = 3;
    local_960._16_8_ = pSVar13;
    pSVar13 = (SynBase *)CreateVariableAccess(ctx,pSVar7,pVVar9,false);
    if (local_960._8_4_ == local_960._12_4_) {
      SmallArray<ExprBase_*,_3U>::grow((SmallArray<ExprBase_*,_3U> *)local_960,local_960._8_4_);
    }
    if ((ArgumentData *)local_960._0_8_ != (ArgumentData *)0x0) {
      uVar19 = (ulong)(uint)local_960._8_4_;
      local_960._8_4_ = local_960._8_4_ + 1;
      ((SynBase **)local_960._0_8_)[uVar19] = pSVar13;
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
      this = (ExprSequence *)CONCAT44(extraout_var_13,iVar4);
      arr_01.count = local_960._8_4_;
      arr_01.data = (ExprBase **)local_960._0_8_;
      arr_01._12_4_ = 0;
      ExprSequence::ExprSequence(this,ctx->allocator,&syntax->super_SynBase,pTVar5,arr_01);
      goto LAB_0017a0d1;
    }
  }
LAB_0017a944:
  pcVar18 = "void SmallArray<ExprBase *, 3>::push_back(const T &) [T = ExprBase *, N = 3]";
LAB_0017a98f:
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,pcVar18);
}

Assistant:

ExprBase* AnalyzeNew(ExpressionContext &ctx, SynNew *syntax)
{
	TypeBase *type = AnalyzeType(ctx, syntax->type, false);

	// If there is no count and we have an array type that failed, take last extend as the size
	if(!type && !syntax->count && isType<SynArrayIndex>(syntax->type))
	{
		SynArrayIndex *arrayIndex = getType<SynArrayIndex>(syntax->type);

		if(arrayIndex->arguments.size() == 1 && !arrayIndex->arguments.head->name)
		{
			syntax->count = arrayIndex->arguments.head->value;
			syntax->type = arrayIndex->value;

			type = AnalyzeType(ctx, syntax->type, false);
		}
	}

	// If there are no arguments and we have a function type that failed, take the arguments list as constructor arguments
	if(!type && syntax->arguments.empty() && isType<SynTypeFunction>(syntax->type))
	{
		SynTypeFunction *functionType = getType<SynTypeFunction>(syntax->type);

		for(SynBase *curr = functionType->arguments.head; curr; curr = curr->next)
			syntax->arguments.push_back(new (ctx.get<SynCallArgument>()) SynCallArgument(curr->begin, curr->end, NULL, curr));

		syntax->type = new (ctx.get<SynTypeReference>()) SynTypeReference(functionType->begin, functionType->end, functionType->returnType);

		type = AnalyzeType(ctx, syntax->type, false);
	}

	// Report the original error
	if(!type)
	{
		AnalyzeType(ctx, syntax->type);

		type = ctx.GetErrorType();
	}

	if(type->isGeneric)
		Stop(ctx, syntax->type, "ERROR: generic type is not allowed");

	if(type == ctx.typeVoid || type == ctx.typeAuto)
		Stop(ctx, syntax->type, "ERROR: can't allocate objects of type '%.*s'", FMT_ISTR(type->name));

	if(TypeClass *typeClass = getType<TypeClass>(type))
	{
		if(!typeClass->completed)
			Stop(ctx, syntax->type, "ERROR: type '%.*s' is not fully defined", FMT_ISTR(type->name));
	}

	SynBase *syntaxInternal = ctx.MakeInternal(syntax);

	if(syntax->count)
	{
		if(!syntax->arguments.empty())
			Report(ctx, syntax->arguments.head, "ERROR: can't provide constructor arguments to array allocation");

		if(!syntax->constructor.empty())
			Report(ctx, syntax->constructor.head, "ERROR: can't provide custom construction code for array allocation");

		ExprBase *count = AnalyzeExpression(ctx, syntax->count);

		ExprBase *alloc = CreateArrayAllocation(ctx, syntax, type, count);

		if(HasDefaultConstructor(ctx, syntax, type))
		{
			VariableData *variable = AllocateTemporary(ctx, syntax, alloc->type);

			ExprBase *initializer = CreateAssignment(ctx, syntax, CreateVariableAccess(ctx, syntaxInternal, variable, false), alloc);
			ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntaxInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, variable), initializer);

			if(ExprBase *call = CreateDefaultConstructorCall(ctx, syntax, variable->type, CreateVariableAccess(ctx, syntaxInternal, variable, true)))
				return CreateSequence(ctx, syntax, definition, call, CreateVariableAccess(ctx, syntaxInternal, variable, true));
		}

		return alloc;
	}

	ExprBase *alloc = CreateObjectAllocation(ctx, syntax, type);

	// Call constructor
	TypeRef *allocType = getType<TypeRef>(alloc->type);

	TypeBase *parentType = allocType->subType;

	SmallArray<FunctionData*, 32> functions(ctx.allocator);

	if(GetTypeConstructorFunctions(ctx, parentType, syntax->arguments.empty(), functions))
	{
		VariableData *variable = AllocateTemporary(ctx, syntax, alloc->type);

		ExprBase *initializer = CreateAssignment(ctx, syntaxInternal, CreateVariableAccess(ctx, syntaxInternal, variable, false), alloc);
		ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntaxInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, variable), initializer);

		ExprBase *overloads = CreateConstructorAccess(ctx, syntax, functions, CreateVariableAccess(ctx, syntaxInternal, variable, false));

		if(ExprBase *call = CreateFunctionCall(ctx, syntax, overloads, IntrusiveList<TypeHandle>(), syntax->arguments.head, syntax->arguments.empty()))
		{
			SmallArray<ExprBase*, 3> expressions(ctx.allocator);

			expressions.push_back(definition);
			expressions.push_back(call);
			expressions.push_back(CreateVariableAccess(ctx, syntaxInternal, variable, false));

			alloc = new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, syntax, allocType, expressions);
		}
	}
	else if(syntax->arguments.size() == 1 && !syntax->arguments.head->name)
	{
		VariableData *variable = AllocateTemporary(ctx, syntax, alloc->type);

		ExprBase *initializer = CreateAssignment(ctx, syntaxInternal, CreateVariableAccess(ctx, syntaxInternal, variable, false), alloc);
		ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntaxInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, variable), initializer);

		ExprBase *copy = CreateAssignment(ctx, syntax, new (ctx.get<ExprDereference>()) ExprDereference(syntax, parentType, CreateVariableAccess(ctx, syntaxInternal, variable, false)), AnalyzeExpression(ctx, syntax->arguments.head->value));

		SmallArray<ExprBase*, 3> expressions(ctx.allocator);

		expressions.push_back(definition);
		expressions.push_back(copy);
		expressions.push_back(CreateVariableAccess(ctx, syntaxInternal, variable, false));

		alloc = new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, syntax, allocType, expressions);
	}
	else if(!syntax->arguments.empty())
	{
		Stop(ctx, syntax, "ERROR: function '%.*s::%.*s' that accepts %d arguments is undefined", FMT_ISTR(parentType->name), FMT_ISTR(parentType->name), syntax->arguments.size());
	}

	// Handle custom constructor
	if(!syntax->constructor.empty())
	{
		VariableData *variable = AllocateTemporary(ctx, syntax, alloc->type);

		ExprBase *initializer = CreateAssignment(ctx, syntaxInternal, CreateVariableAccess(ctx, syntaxInternal, variable, false), alloc);
		ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntaxInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, variable), initializer);

		TypedFunctionInstanceRequest request(parentType, syntax);

		ExprBase *function = NULL;

		if(ExprBase **it = ctx.newConstructorFunctions.find(request))
			function = *it;

		if(!function)
		{
			// Create a member function with the constructor body
			InplaceStr name = GetTemporaryFunctionName(ctx);

			SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(name);

			function = CreateFunctionDefinition(ctx, syntax, false, false, parentType, false, ctx.typeVoid, false, nameIdentifier, IntrusiveList<SynIdentifier>(), IntrusiveList<SynFunctionArgument>(), syntax->constructor, NULL, NULL, IntrusiveList<MatchData>());

			ctx.newConstructorFunctions.insert(request, function);
		}

		ExprFunctionDefinition *functionDefinition = getType<ExprFunctionDefinition>(function);

		// Call this member function
		SmallArray<FunctionValue, 32> functions(ctx.allocator);
		functions.push_back(FunctionValue(syntax, functionDefinition->function, CreateVariableAccess(ctx, syntaxInternal, variable, false)));

		SmallArray<ArgumentData, 32> arguments(ctx.allocator);

		ExprBase *call = CreateFunctionCallFinal(ctx, syntax, function, functions, IntrusiveList<TypeHandle>(), arguments, false);

		SmallArray<ExprBase*, 3> expressions(ctx.allocator);

		expressions.push_back(definition);
		expressions.push_back(call);
		expressions.push_back(CreateVariableAccess(ctx, syntaxInternal, variable, false));

		alloc = new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, syntax, allocType, expressions);
	}

	return alloc;
}